

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O1

void at_your_feet(char *str)

{
  char *pcVar1;
  char *line;
  char *pcVar2;
  char *pcVar3;
  
  if (((u.uprops[0x1e].intrinsic != 0) ||
      (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    str = "Something";
  }
  if ((u._1052_1_ & 1) == 0) {
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((pcVar2 = "lands", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar2 = vtense(str,"appear");
    }
    if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
      pcVar3 = "at";
      if ((youmonst.data)->mlet == '\x05') {
        pcVar3 = "beneath";
      }
    }
    else {
      pcVar3 = "beneath";
    }
    pcVar1 = body_part(5);
    pcVar1 = makeplural(pcVar1);
    line = "%s %s %s your %s!";
  }
  else {
    pcVar2 = vtense(str,"drop");
    pcVar3 = mon_nam(u.ustuck);
    pcVar3 = s_suffix(pcVar3);
    pcVar1 = mbodypart(u.ustuck,0x12);
    line = "%s %s into %s %s.";
  }
  pline(line,str,pcVar2,pcVar3,pcVar1);
  return;
}

Assistant:

static void at_your_feet(const char *str)
{
	if (Blind) str = "Something";
	if (u.uswallow) {
	    /* barrier between you and the floor */
	    pline("%s %s into %s %s.", str, vtense(str, "drop"),
		  s_suffix(mon_nam(u.ustuck)), mbodypart(u.ustuck, STOMACH));
	} else {
	    pline("%s %s %s your %s!", str,
		  Blind ? "lands" : vtense(str, "appear"),
		  Levitation ? "beneath" : "at",
		  makeplural(body_part(FOOT)));
	}
}